

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O3

Vector3 * __thiscall
stateObservation::kine::Orientation::operator*
          (Vector3 *__return_storage_ptr__,Orientation *this,Vector3 *v)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  byte bVar6;
  char *__function;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  bVar3 = (this->q_).isSet_.b_;
  bVar6 = (this->m_).isSet_.b_;
  if ((bVar3 == false) && ((bVar6 & 1) == 0)) {
    __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
  }
  if ((bVar6 & 1) == 0) {
    if ((bVar3 == false) || ((this->q_).assertMsg_.b_ == (char *)0x0)) {
      __function = 
      "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
      ;
      goto LAB_0011ae19;
    }
    dVar1 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[0];
    dVar2 = *(double *)
             ((long)(this->q_).v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 0x18);
    dVar7 = dVar1 * (dVar1 + dVar1);
    dVar8 = (dVar1 + dVar1) * dVar2;
    dVar4 = *(double *)
             ((long)(this->q_).v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 8);
    dVar5 = *(double *)
             ((long)(this->q_).v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 0x10);
    dVar9 = dVar4 + dVar4;
    dVar10 = dVar5 + dVar5;
    (this->m_).isSet_.b_ = true;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = 1.0 - (dVar9 * dVar4 + dVar10 * dVar5);
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = dVar1 * dVar9 + dVar10 * dVar2;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = dVar1 * dVar10 - dVar9 * dVar2;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = dVar1 * dVar9 - dVar10 * dVar2;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = 1.0 - (dVar10 * dVar5 + dVar7);
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = dVar10 * dVar4 + dVar8;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = dVar1 * dVar10 + dVar9 * dVar2;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = dVar10 * dVar4 - dVar8;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = 1.0 - (dVar9 * dVar4 + dVar7);
    bVar6 = 1;
  }
  if (((bVar6 & 1) != 0) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
    dVar1 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [0];
    dVar2 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [1];
    dVar4 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [2];
    dVar5 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[1];
    dVar7 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[4];
    dVar8 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[7];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         dVar4 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[6] +
         dVar2 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[3] +
         dVar1 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar4 * dVar8 + dVar2 * dVar7 + dVar1 * dVar5;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] =
         (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
         .array[8] * dVar4 +
         (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
         .array[5] * dVar2 +
         dVar1 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[2];
    return __return_storage_ptr__;
  }
  __function = 
  "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
  ;
LAB_0011ae19:
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline Vector3 Orientation::operator*(const Vector3 & v) const
{
  check_();
  if(!isMatrixSet())
  {
    quaternionToMatrix_();
  }
  return m_() * v;
}